

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O1

vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> * __thiscall
Pda::findEclosure(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__return_storage_ptr__,
                 Pda *this,Node *n)

{
  pointer *pppNVar1;
  pointer ppTVar2;
  iterator __position;
  bool bVar3;
  char cVar4;
  bool bVar5;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar6;
  Pda *pPVar7;
  Node *n_00;
  string *newTop;
  _Elt_pointer pcVar8;
  char *pcVar9;
  bool bVar10;
  pointer ppTVar11;
  pointer ppNVar12;
  bool bVar13;
  Node *next;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newclosure;
  Pda *local_100;
  void *local_f8;
  iterator iStack_f0;
  Node **local_e8;
  Node *local_e0;
  pointer local_d8;
  _Deque_base<char,_std::allocator<char>_> local_d0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppNVar12 = (__return_storage_ptr__->
             super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_e0 = n;
  if (ppNVar12 == (pointer)0x0) {
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,
               (iterator)0x0,&local_e0);
  }
  else {
    *ppNVar12 = n;
    pppNVar1 = &(__return_storage_ptr__->
                super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  bVar3 = true;
  do {
    local_f8 = (void *)0x0;
    iStack_f0._M_current = (Node **)0x0;
    local_e8 = (Node **)0x0;
    ppNVar12 = (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_d8 = (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppNVar12 == local_d8) {
      bVar10 = false;
    }
    else {
      bVar10 = false;
      do {
        pvVar6 = Tjen::Node::getTransitions(*ppNVar12);
        ppTVar2 = (pvVar6->
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppTVar11 = (pvVar6->
                        super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppTVar11 != ppTVar2;
            ppTVar11 = ppTVar11 + 1) {
          cVar4 = Tjen::Node::Transition::getInput(*ppTVar11);
          pPVar7 = (Pda *)operator_new(0x88);
          n_00 = Tjen::Node::Transition::getTo(*ppTVar11);
          Tjen::Node::Node((Node *)pPVar7,n_00);
          local_100 = pPVar7;
          Tjen::Node::getStack
                    ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80,*ppNVar12);
          Tjen::Node::setStack
                    ((Node *)pPVar7,
                     (stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80);
          std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
          pPVar7 = local_100;
          if (cVar4 == -0x32) {
            newTop = Tjen::Node::Transition::getNewstack_abi_cxx11_(*ppTVar11);
            Tjen::Node::editStack((Node *)pPVar7,newTop);
            bVar5 = checkIfDouble(pPVar7,__return_storage_ptr__,(Node *)local_100);
            if (bVar5) {
              bVar13 = false;
            }
            else {
              Tjen::Node::getStack
                        ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_d0,
                         *ppNVar12);
              pcVar8 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_d0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_d0._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pcVar8 = local_d0._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
              }
              cVar4 = pcVar8[-1];
              pcVar9 = Tjen::Node::Transition::getOldStack(*ppTVar11);
              bVar13 = cVar4 == *pcVar9;
            }
            if (!bVar5) {
              std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
            }
            if (bVar13) {
              if (iStack_f0._M_current == local_e8) {
                bVar10 = true;
                std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
                _M_realloc_insert<Tjen::Node*const&>
                          ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)&local_f8,iStack_f0,
                           (Node **)&local_100);
              }
              else {
                *iStack_f0._M_current = (Node *)local_100;
                iStack_f0._M_current = iStack_f0._M_current + 1;
                bVar10 = true;
              }
            }
          }
        }
        ppNVar12 = ppNVar12 + 1;
      } while (ppNVar12 != local_d8);
    }
    if (bVar3) {
      pppNVar1 = &(__return_storage_ptr__->
                  super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + -1;
      bVar3 = false;
    }
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start,local_f8,iStack_f0._M_current);
    if (local_f8 != (void *)0x0) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
  } while (bVar10);
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::_M_realloc_insert<Tjen::Node*const&>
              ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)__return_storage_ptr__,__position,
               &local_e0);
  }
  else {
    *__position._M_current = local_e0;
    pppNVar1 = &(__return_storage_ptr__->
                super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tjen::Node*> Pda::findEclosure(Tjen::Node *n) {

    std::vector<Tjen::Node *> eclosure; //totaal
    eclosure.push_back(n);

    bool found = true;
    bool first = true;
    while (found) {

        std::vector<Tjen::Node *> newclosure; //gevonden

        found = false;
        for (auto &node: eclosure) {
            for (auto &f: node->getTransitions()) {
                const char in = f->getInput();
                const char *e = "ε";

                Tjen::Node *next = new Tjen::Node(f->getTo());
                next->setStack(node->getStack());
                if (in == *e) {
                    next->editStack(f->getNewstack());

                    if (!checkIfDouble(eclosure, next) && node->getStack().top() == f->getOldStack()) {
                        newclosure.push_back(next);
                        found = true;
                    }

                }

            }
        }
        if (first) {
            eclosure.pop_back();
            first = false;
        }
        eclosure.insert(eclosure.begin(), newclosure.begin(), newclosure.end());
    }
    eclosure.push_back(n);
    return eclosure;
}